

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O0

bool __thiscall
VvcUnit::ols_timing_hrd_parameters
          (VvcUnit *this,VvcHrdUnit m_hrd,int firstSubLayer,int MaxSubLayersVal)

{
  bool bVar1;
  uint uVar2;
  bool local_61;
  int local_34;
  bool fixed_pic_rate_within_cvs_flag;
  int i;
  int MaxSubLayersVal_local;
  int firstSubLayer_local;
  VvcUnit *this_local;
  VvcHrdUnit m_hrd_local;
  
  local_34 = firstSubLayer;
  do {
    if (MaxSubLayersVal < local_34) {
      return false;
    }
    bVar1 = BitStreamReader::getBit(&this->m_reader);
    if (bVar1) {
      local_61 = true;
    }
    else {
      local_61 = BitStreamReader::getBit(&this->m_reader);
    }
    if (local_61 == false) {
      if (((((undefined1  [16])m_hrd & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (((undefined1  [16])m_hrd & (undefined1  [16])0x100) != (undefined1  [16])0x0)) &&
         (m_hrd_local.time_scale = m_hrd.hrd_cpb_cnt_minus1, m_hrd_local.time_scale == 0)) {
        BitStreamReader::skipBit(&this->m_reader);
      }
    }
    else {
      uVar2 = extractUEGolombCode(this);
      if (0x7ff < uVar2) {
        return true;
      }
    }
    if (((undefined1  [16])m_hrd & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sublayer_hrd_parameters(this,m_hrd);
    }
    if (((undefined1  [16])m_hrd & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
      sublayer_hrd_parameters(this,m_hrd);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool VvcUnit::ols_timing_hrd_parameters(const VvcHrdUnit m_hrd, const int firstSubLayer, const int MaxSubLayersVal)
{
    for (int i = firstSubLayer; i <= MaxSubLayersVal; i++)
    {
        const bool fixed_pic_rate_within_cvs_flag =
            m_reader.getBit() /* fixed_pic_rate_general_flag) */ ? true : m_reader.getBit();
        if (fixed_pic_rate_within_cvs_flag)
        {
            if (extractUEGolombCode() > 2047)  // elemental_duration_in_tc_minus1
                return true;
        }
        else if ((m_hrd.general_nal_hrd_params_present_flag || m_hrd.general_vcl_hrd_params_present_flag) &&
                 m_hrd.hrd_cpb_cnt_minus1 == 0)
            m_reader.skipBit();  // low_delay_hrd_flag
        if (m_hrd.general_nal_hrd_params_present_flag)
            sublayer_hrd_parameters(m_hrd);
        if (m_hrd.general_vcl_hrd_params_present_flag)
            sublayer_hrd_parameters(m_hrd);
    }
    return false;
}